

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

string * embree::getExecutableFileName_abi_cxx11_(void)

{
  __pid_t _Var1;
  char *__path;
  ssize_t sVar2;
  string *in_RDI;
  char buf [4096];
  string pid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef50;
  allocator *paVar3;
  string *__lhs;
  allocator local_108d;
  undefined4 local_108c;
  char local_1088 [32];
  longlong in_stack_ffffffffffffef98;
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  long local_10;
  string *local_8;
  
  __lhs = in_RDI;
  _Var1 = getpid();
  local_10 = (long)_Var1;
  local_8 = local_78;
  std::__cxx11::to_string(in_stack_ffffffffffffef98);
  std::operator+((char *)__lhs,in_stack_ffffffffffffef50);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffef50);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  memset(local_1088,0,0x1000);
  __path = (char *)std::__cxx11::string::c_str();
  sVar2 = readlink(__path,local_1088,0xfff);
  if (sVar2 == -1) {
    std::__cxx11::string::string((string *)__lhs);
  }
  else {
    paVar3 = &local_108d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__lhs,local_1088,paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_108d);
  }
  local_108c = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string getExecutableFileName() 
  {
    std::string pid = "/proc/" + toString(getpid()) + "/exe";
    char buf[4096];
    memset(buf,0,sizeof(buf));
    if (readlink(pid.c_str(), buf, sizeof(buf)-1) == -1)
      return std::string();
    return std::string(buf);
  }